

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void pbrt::getCategoryAndTitle(string *str,string *category,string *title)

{
  long lVar1;
  char in_R8B;
  string_view str_00;
  int vb;
  size_type va;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  
  str_00._M_str = (char *)0x2f;
  str_00._M_len = (size_t)(str->_M_dataplus)._M_p;
  SplitString_abi_cxx11_(&comps,(pbrt *)str->_M_string_length,str_00,in_R8B);
  lVar1 = (long)comps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)comps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0x20) {
    va = lVar1 >> 5;
    vb = 2;
    if (lVar1 != 0x40) {
      LogFatal<char_const(&)[13],char_const(&)[2],char_const(&)[13],unsigned_long&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                 ,0x156,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"comps.size()"
                 ,(char (*) [2])0x43aaf2,(char (*) [13])"comps.size()",&va,(char (*) [2])0x43aaf2,
                 &vb);
    }
    std::__cxx11::string::_M_assign((string *)category);
  }
  std::__cxx11::string::_M_assign((string *)title);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comps);
  return;
}

Assistant:

static void getCategoryAndTitle(const std::string &str, std::string *category,
                                std::string *title) {
    std::vector<std::string> comps = SplitString(str, '/');
    if (comps.size() == 1)
        *title = comps[0];
    else {
        CHECK_EQ(comps.size(), 2);
        *category = comps[0];
        *title = comps[1];
    }
}